

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O1

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::SkipFallback
          (EpsCopyInputStream *this,char *ptr,int size)

{
  char *pcVar1;
  int iVar2;
  
  iVar2 = (*(int *)&this->buffer_end_ - (int)ptr) + 0x10;
  do {
    if (this->next_chunk_ == (char *)0x0) {
      return (char *)0x0;
    }
    if (this->limit_ < 0x11) {
      return (char *)0x0;
    }
    pcVar1 = Next(this);
    if (pcVar1 == (char *)0x0) {
      return (char *)0x0;
    }
    size = size - iVar2;
    iVar2 = (*(int *)&this->buffer_end_ - (int)(pcVar1 + 0x10)) + 0x10;
  } while (iVar2 < size);
  return pcVar1 + 0x10 + size;
}

Assistant:

const char* EpsCopyInputStream::SkipFallback(const char* ptr, int size) {
  return AppendSize(ptr, size, [](const char* p, int s) {});
}